

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

void __thiscall
Protocol::MQTT::V5::Property<unsigned_short>::dump
          (Property<unsigned_short> *this,FastString *out,int indent)

{
  char *pcVar1;
  String local_30;
  
  pcVar1 = PrivateRegistry::getPropertyName((this->super_PropertyBaseImpl).super_PropertyBase.type);
  MQTTStringPrintf((char *)&local_30,"%*sType %s\n",(ulong)(uint)indent,"",pcVar1);
  Bstrlib::String::operator+=(out,&local_30);
  Bstrlib::String::~String(&local_30);
  MQTTStringPrintf((char *)&local_30,"%*s",(ulong)(indent + 2),"");
  Bstrlib::String::operator+=(out,&local_30);
  Bstrlib::String::~String(&local_30);
  Bstrlib::String::operator+=(out,(uint)(this->value).value);
  Bstrlib::String::operator+=(out,"\n");
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*sType %s\n", indent, "", PrivateRegistry::getPropertyName(type));
                    out += MQTTStringPrintf("%*s", indent+2, ""); out += (T)value; out += "\n";
                }